

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmatrix.h
# Opt level: O2

basic_istream<char,_std::char_traits<char>_> *
gmath::operator>>(basic_istream<char,_std::char_traits<char>_> *in,DMatrix<double> *a)

{
  int iVar1;
  double *pdVar2;
  char cVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  char c;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  elem;
  _Vector_base<double,_std::allocator<double>_> local_58;
  double v;
  
  elem.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  elem.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  elem.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::operator>>(in,&c);
  if (c == '[') {
    cVar3 = '[';
LAB_00159df7:
    if ((cVar3 != ']') && (((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 5) == 0)) {
      std::operator>>(in,&c);
      if (c != ';') goto code_r0x00159e26;
      goto LAB_00159e36;
    }
    if (((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 5) == 0) {
      uVar4 = ((long)elem.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)elem.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x18;
      if ((int)uVar4 < 1) {
        uVar6 = 0;
      }
      else {
        uVar6 = (uint)((ulong)((long)((elem.
                                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)((elem.
                                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                    super__Vector_impl_data._M_start) >> 3);
      }
      DMatrix<double>::init(a,(EVP_PKEY_CTX *)(uVar4 & 0xffffffff));
      uVar5 = 0;
      if ((int)uVar6 < 1) {
        uVar6 = 0;
      }
      uVar7 = uVar4 & 0xffffffff;
      if ((int)uVar4 < 1) {
        uVar7 = 0;
      }
      for (; uVar5 != uVar7; uVar5 = uVar5 + 1) {
        iVar1 = a->ncols;
        pdVar2 = a->v;
        for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
          pdVar2[(long)(iVar1 * (int)uVar5) + uVar4] =
               elem.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar5].
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar4];
        }
      }
    }
  }
  else {
    std::ios::setstate((int)*(undefined8 *)(*(long *)in + -0x18) + (int)in);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&elem);
  return in;
code_r0x00159e26:
  cVar3 = c;
  if (c != ']') {
    std::istream::putback((char)in);
LAB_00159e36:
    local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
    ::emplace_back<std::vector<double,std::allocator<double>>>
              ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                *)&elem,(vector<double,_std::allocator<double>_> *)&local_58);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_58);
    while( true ) {
      if (((c == ';') || (c == ']')) || (((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 5) != 0)
         ) break;
      std::operator>>(in,&c);
      if ((c != ';') && (c != ']')) {
        std::istream::putback((char)in);
        std::istream::_M_extract<double>((double *)in);
        std::vector<double,_std::allocator<double>_>::push_back
                  (elem.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1,&v);
      }
    }
    cVar3 = c;
    if ((((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 5) == 0) &&
       ((long)((elem.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)((elem.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
              _M_start !=
        (long)elem.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)elem.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start)) {
      std::ios::setstate((int)*(long *)(*(long *)in + -0x18) + (int)in);
      cVar3 = c;
    }
  }
  goto LAB_00159df7;
}

Assistant:

std::basic_istream<Ch, Tr> &operator>>(std::basic_istream<Ch, Tr> &in, DMatrix<T> &a)
{
  T    v;
  std::vector<std::vector<T> > elem;
  char c;

  in >> c;

  if (c == '[')
  {
    while (c != ']' && in)
    {
      in >> c;

      if (c != ']')
      {
        if (c != ';')
        {
          in.putback(c);
        }

        elem.push_back(std::vector<T>());

        while (c != ';' && c != ']' && in)
        {
          in >> c;

          if (c != ';' && c != ']')
          {
            in.putback(c);

            in >> v;
            elem.back().push_back(v);
          }
        }

        if (in && elem.front().size() != elem.back().size())
        {
          in.setstate(std::ios_base::failbit);
        }
      }
    }

    if (in)
    {
      int rows=static_cast<int>(elem.size());
      int cols=0;

      if (rows > 0)
      {
        cols=static_cast<int>(elem.front().size());
      }

      a.init(rows, cols);

      for (int k=0; k<rows; k++)
        for (int i=0; i<cols; i++)
        {
          a(k, i)=elem[k][i];
        }
    }
  }
  else
  {
    in.setstate(std::ios_base::failbit);
  }

  return in;
}